

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall gl4cts::TextureViewTestViewSampling::deinit(TextureViewTestViewSampling *this)

{
  _reference_color_storage *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  deinitIterationSpecificProgramAndShaderObjects(this);
  deinitPerSampleFillerProgramAndShaderObjects(this);
  deinitTextureObjects(this);
  if (this->m_result_data != (uchar *)0x0) {
    operator_delete__(this->m_result_data);
    this->m_result_data = (uchar *)0x0;
  }
  if (this->m_bo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  p_Var1 = this->m_reference_color_storage;
  if (p_Var1 != (_reference_color_storage *)0x0) {
    if (p_Var1->data != (Vec4 *)0x0) {
      operator_delete__(p_Var1->data);
      p_Var1->data = (Vec4 *)0x0;
    }
    operator_delete(p_Var1,0x18);
    this->m_reference_color_storage = (_reference_color_storage *)0x0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  (**(code **)(lVar3 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  (**(code **)(lVar3 + 0xff0))(0xcf5,4);
  return;
}

Assistant:

void TextureViewTestViewSampling::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	deinitIterationSpecificProgramAndShaderObjects();
	deinitPerSampleFillerProgramAndShaderObjects();
	deinitTextureObjects();

	/* Make sure any buffers we may have allocated during the execution do not leak */
	if (m_result_data != DE_NULL)
	{
		delete[] m_result_data;

		m_result_data = DE_NULL;
	}

	/* Deinitialize other objects that are not re-created every iteration */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_reference_color_storage != DE_NULL)
	{
		delete m_reference_color_storage;

		m_reference_color_storage = DE_NULL;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Restore default GL state the test may have modified */
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);
}